

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleInterpolationTests.cpp
# Opt level: O3

void __thiscall
vkt::pipeline::multisample::
MSInstance<vkt::pipeline::multisample::MSInstanceInterpolateBarycentricCoordinates>::
uploadVertexData(MSInstance<vkt::pipeline::multisample::MSInstanceInterpolateBarycentricCoordinates>
                 *this,Allocation *vertexBufferAllocation,VertexDataDesc *vertexDataDescripton)

{
  pointer __src;
  vector<vkt::pipeline::multisample::VertexDataNdcBarycentric,_std::allocator<vkt::pipeline::multisample::VertexDataNdcBarycentric>_>
  vertices;
  vector<vkt::pipeline::multisample::VertexDataNdcBarycentric,_std::allocator<vkt::pipeline::multisample::VertexDataNdcBarycentric>_>
  local_58;
  VertexDataNdcBarycentric local_38;
  
  local_58.
  super__Vector_base<vkt::pipeline::multisample::VertexDataNdcBarycentric,_std::allocator<vkt::pipeline::multisample::VertexDataNdcBarycentric>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<vkt::pipeline::multisample::VertexDataNdcBarycentric,_std::allocator<vkt::pipeline::multisample::VertexDataNdcBarycentric>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<vkt::pipeline::multisample::VertexDataNdcBarycentric,_std::allocator<vkt::pipeline::multisample::VertexDataNdcBarycentric>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38.positionNdc.m_data[0] = -1.0;
  local_38.positionNdc.m_data[1] = -1.0;
  local_38.positionNdc.m_data[2] = 0.0;
  local_38.positionNdc.m_data[3] = 1.0;
  local_38.barycentricCoord.m_data[0] = 0.0;
  local_38.barycentricCoord.m_data[1] = 0.0;
  local_38.barycentricCoord.m_data[2] = 1.0;
  std::
  vector<vkt::pipeline::multisample::VertexDataNdcBarycentric,_std::allocator<vkt::pipeline::multisample::VertexDataNdcBarycentric>_>
  ::emplace_back<vkt::pipeline::multisample::VertexDataNdcBarycentric>(&local_58,&local_38);
  local_38.positionNdc.m_data[0] = -1.0;
  local_38.positionNdc.m_data[1] = 1.0;
  local_38.positionNdc.m_data[2] = 0.0;
  local_38.positionNdc.m_data[3] = 1.0;
  local_38.barycentricCoord.m_data[0] = 1.0;
  local_38.barycentricCoord.m_data[1] = 0.0;
  local_38.barycentricCoord.m_data[2] = 0.0;
  std::
  vector<vkt::pipeline::multisample::VertexDataNdcBarycentric,_std::allocator<vkt::pipeline::multisample::VertexDataNdcBarycentric>_>
  ::emplace_back<vkt::pipeline::multisample::VertexDataNdcBarycentric>(&local_58,&local_38);
  local_38.positionNdc.m_data[0] = 1.0;
  local_38.positionNdc.m_data[1] = -1.0;
  local_38.positionNdc.m_data[2] = 0.0;
  local_38.positionNdc.m_data[3] = 1.0;
  local_38.barycentricCoord.m_data[0] = 0.0;
  local_38.barycentricCoord.m_data[1] = 1.0;
  local_38.barycentricCoord.m_data[2] = 0.0;
  std::
  vector<vkt::pipeline::multisample::VertexDataNdcBarycentric,_std::allocator<vkt::pipeline::multisample::VertexDataNdcBarycentric>_>
  ::emplace_back<vkt::pipeline::multisample::VertexDataNdcBarycentric>(&local_58,&local_38);
  __src = (pointer)0x0;
  if (local_58.
      super__Vector_base<vkt::pipeline::multisample::VertexDataNdcBarycentric,_std::allocator<vkt::pipeline::multisample::VertexDataNdcBarycentric>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_58.
      super__Vector_base<vkt::pipeline::multisample::VertexDataNdcBarycentric,_std::allocator<vkt::pipeline::multisample::VertexDataNdcBarycentric>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    __src = local_58.
            super__Vector_base<vkt::pipeline::multisample::VertexDataNdcBarycentric,_std::allocator<vkt::pipeline::multisample::VertexDataNdcBarycentric>_>
            ._M_impl.super__Vector_impl_data._M_start;
  }
  memcpy(vertexBufferAllocation->m_hostPtr,__src,vertexDataDescripton->dataSize);
  if (local_58.
      super__Vector_base<vkt::pipeline::multisample::VertexDataNdcBarycentric,_std::allocator<vkt::pipeline::multisample::VertexDataNdcBarycentric>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.
                    super__Vector_base<vkt::pipeline::multisample::VertexDataNdcBarycentric,_std::allocator<vkt::pipeline::multisample::VertexDataNdcBarycentric>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super__Vector_base<vkt::pipeline::multisample::VertexDataNdcBarycentric,_std::allocator<vkt::pipeline::multisample::VertexDataNdcBarycentric>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super__Vector_base<vkt::pipeline::multisample::VertexDataNdcBarycentric,_std::allocator<vkt::pipeline::multisample::VertexDataNdcBarycentric>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void MSInstance<MSInstanceInterpolateBarycentricCoordinates>::uploadVertexData (const Allocation& vertexBufferAllocation, const VertexDataDesc& vertexDataDescripton) const
{
	// Create buffer storing vertex data
	std::vector<VertexDataNdcBarycentric> vertices;

	vertices.push_back(VertexDataNdcBarycentric(tcu::Vec4(-1.0f, -1.0f, 0.0f, 1.0f), tcu::Vec3(0.0f, 0.0f, 1.0f)));
	vertices.push_back(VertexDataNdcBarycentric(tcu::Vec4(-1.0f,  1.0f, 0.0f, 1.0f), tcu::Vec3(1.0f, 0.0f, 0.0f)));
	vertices.push_back(VertexDataNdcBarycentric(tcu::Vec4( 1.0f, -1.0f, 0.0f, 1.0f), tcu::Vec3(0.0f, 1.0f, 0.0f)));

	deMemcpy(vertexBufferAllocation.getHostPtr(), dataPointer(vertices), static_cast<std::size_t>(vertexDataDescripton.dataSize));
}